

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O2

void despot::option::PrintUsageImplementation::indent(IStringWriter *write,int *x,int want_x)

{
  undefined8 in_RAX;
  int iVar1;
  bool bVar2;
  undefined7 uStack_38;
  char space;
  
  iVar1 = want_x - *x;
  _uStack_38 = in_RAX;
  if (want_x - *x < 0) {
    (*write->_vptr_IStringWriter[2])(write,"\n",1);
    iVar1 = want_x;
  }
  if (0 < iVar1) {
    _uStack_38 = CONCAT17(0x20,uStack_38);
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      (*write->_vptr_IStringWriter[2])(write,&space,1);
    }
    *x = want_x;
  }
  return;
}

Assistant:

static void indent(IStringWriter& write, int& x, int want_x) {
		int indent = want_x - x;
		if (indent < 0) {
			write("\n", 1);
			indent = want_x;
		}

		if (indent > 0) {
			char space = ' ';
			for (int i = 0; i < indent; ++i)
				write(&space, 1);
			x = want_x;
		}
	}